

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O2

void __thiscall
DListBase<Memory::ArenaData_*,_RealCount>::RemoveElement<Memory::NoThrowHeapAllocator>
          (DListBase<Memory::ArenaData_*,_RealCount> *this,NoThrowHeapAllocator *allocator,
          ArenaData **element)

{
  BigBlock *pBVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  DListNode<Memory::ArenaData_*> *obj;
  
  obj = (DListNode<Memory::ArenaData_*> *)(element + -2);
  bVar3 = HasNode(this,(NodeBase *)obj);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                       ,0x175,"(HasNode(node))","HasNode(node)");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pBVar1 = (BigBlock *)(obj->super_DListNodeBase<Memory::ArenaData_*>).next.node;
  element[-1]->bigBlocks = pBVar1;
  (pBVar1->super_ArenaMemoryBlock).nbytes = (size_t)element[-1];
  Memory::
  DeleteObject<Memory::NoThrowHeapAllocator,(Memory::AllocatorDeleteFlags)0,DListNode<Memory::ArenaData*>>
            (allocator,obj);
  (this->super_RealCount).count = (this->super_RealCount).count - 1;
  return;
}

Assistant:

void RemoveElement(TAllocator * allocator, TData * element)
    {
        Node * node = CONTAINING_RECORD(element, Node, data);
#if DBG_DUMP
        Assert(HasNode(node));
#endif
        DListBase::RemoveNode(node);
        AllocatorDelete(TAllocator, allocator, node);

        this->DecrementCount();

    }